

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O1

void EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
               (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *elements,
               _func_bool_NodeEvictionCandidate_ptr_NodeEvictionCandidate_ptr *comparator,size_t k,
               function<bool_(const_NodeEvictionCandidate_&)> *predicate)

{
  long lVar1;
  __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  __last;
  NodeEvictionCandidate *pNVar2;
  pointer pNVar3;
  long lVar4;
  function<bool_(const_NodeEvictionCandidate_&)> __pred;
  ulong uVar5;
  __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  _Var6;
  pointer pNVar7;
  long in_FS_OFFSET;
  _Any_data in_stack_ffffffffffffffa8;
  _Manager_type in_stack_ffffffffffffffb8;
  _Invoker_type in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var6._M_current =
       (elements->super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (elements->super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var6._M_current != __last._M_current) {
    uVar5 = ((long)__last._M_current - (long)_Var6._M_current >> 3) * -0x71c71c71c71c71c7;
    lVar4 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>>
              (_Var6,__last,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_NodeEvictionCandidate_&,_const_NodeEvictionCandidate_&)>
                )comparator);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>>
              (_Var6,__last,
               (_Iter_comp_iter<bool_(*)(const_NodeEvictionCandidate_&,_const_NodeEvictionCandidate_&)>
                )comparator);
  }
  _Var6._M_current =
       (elements->super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = ((long)_Var6._M_current -
           (long)(elements->
                 super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  if (k <= uVar5) {
    uVar5 = k;
  }
  std::function<bool_(const_NodeEvictionCandidate_&)>::function
            ((function<bool_(const_NodeEvictionCandidate_&)> *)&stack0xffffffffffffffa8,predicate);
  __pred.super__Function_base._M_manager = in_stack_ffffffffffffffb8;
  __pred.super__Function_base._M_functor = in_stack_ffffffffffffffa8;
  __pred._M_invoker = in_stack_ffffffffffffffc0;
  _Var6 = std::
          remove_if<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,std::function<bool(NodeEvictionCandidate_const&)>>
                    (_Var6._M_current + -uVar5,_Var6,__pred);
  pNVar2 = (elements->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((_Var6._M_current != pNVar2) &&
     (pNVar3 = (elements->
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
               _M_impl.super__Vector_impl_data._M_finish,
     pNVar7 = (pointer)((long)_Var6._M_current + ((long)pNVar3 - (long)pNVar2)), pNVar3 != pNVar7))
  {
    (elements->super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
    _M_impl.super__Vector_impl_data._M_finish = pNVar7;
  }
  if (in_stack_ffffffffffffffb8 != (_Manager_type)0x0) {
    (*in_stack_ffffffffffffffb8)
              ((_Any_data *)&stack0xffffffffffffffa8,(_Any_data *)&stack0xffffffffffffffa8,
               __destroy_functor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void EraseLastKElements(
    std::vector<T>& elements, Comparator comparator, size_t k,
    std::function<bool(const NodeEvictionCandidate&)> predicate = [](const NodeEvictionCandidate& n) { return true; })
{
    std::sort(elements.begin(), elements.end(), comparator);
    size_t eraseSize = std::min(k, elements.size());
    elements.erase(std::remove_if(elements.end() - eraseSize, elements.end(), predicate), elements.end());
}